

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fwd_txfm_transpose_8x8_avx2(__m256i *in,__m256i *out,int instride,int outstride)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int in_ECX;
  int in_EDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i x1;
  __m256i x0;
  __m256i u7;
  __m256i u6;
  __m256i u5;
  __m256i u4;
  __m256i u3;
  __m256i u2;
  __m256i u1;
  __m256i u0;
  
  auVar5 = vpunpckldq_avx2(*in_RDI,in_RDI[in_EDX]);
  auVar1 = vpunpckhdq_avx2(*in_RDI,in_RDI[in_EDX]);
  auVar6 = vpunpckldq_avx2(in_RDI[in_EDX * 2],in_RDI[in_EDX * 3]);
  auVar2 = vpunpckhdq_avx2(in_RDI[in_EDX * 2],in_RDI[in_EDX * 3]);
  auVar7 = vpunpckldq_avx2(in_RDI[in_EDX << 2],in_RDI[in_EDX * 5]);
  auVar3 = vpunpckhdq_avx2(in_RDI[in_EDX << 2],in_RDI[in_EDX * 5]);
  auVar8 = vpunpckldq_avx2(in_RDI[in_EDX * 6],in_RDI[in_EDX * 7]);
  auVar4 = vpunpckhdq_avx2(in_RDI[in_EDX * 6],in_RDI[in_EDX * 7]);
  auVar9 = vpunpcklqdq_avx2(auVar5,auVar6);
  auVar10 = vpunpcklqdq_avx2(auVar7,auVar8);
  auVar11 = vperm2i128_avx2(auVar9,auVar10,0x20);
  *in_RSI = auVar11;
  auVar9 = vperm2i128_avx2(auVar9,auVar10,0x31);
  in_RSI[in_ECX << 2] = auVar9;
  auVar5 = vpunpckhqdq_avx2(auVar5,auVar6);
  auVar6 = vpunpckhqdq_avx2(auVar7,auVar8);
  auVar7 = vperm2i128_avx2(auVar5,auVar6,0x20);
  in_RSI[in_ECX] = auVar7;
  auVar5 = vperm2i128_avx2(auVar5,auVar6,0x31);
  in_RSI[in_ECX * 5] = auVar5;
  auVar5 = vpunpcklqdq_avx2(auVar1,auVar2);
  auVar6 = vpunpcklqdq_avx2(auVar3,auVar4);
  auVar7 = vperm2i128_avx2(auVar5,auVar6,0x20);
  in_RSI[in_ECX * 2] = auVar7;
  auVar5 = vperm2i128_avx2(auVar5,auVar6,0x31);
  in_RSI[in_ECX * 6] = auVar5;
  auVar1 = vpunpckhqdq_avx2(auVar1,auVar2);
  auVar2 = vpunpckhqdq_avx2(auVar3,auVar4);
  auVar3 = vperm2i128_avx2(auVar1,auVar2,0x20);
  in_RSI[in_ECX * 3] = auVar3;
  auVar1 = vperm2i128_avx2(auVar1,auVar2,0x31);
  in_RSI[in_ECX * 7] = auVar1;
  return;
}

Assistant:

static void fwd_txfm_transpose_8x8_avx2(const __m256i *in, __m256i *out,
                                        const int instride,
                                        const int outstride) {
  __m256i u0, u1, u2, u3, u4, u5, u6, u7;
  __m256i x0, x1;

  u0 = _mm256_unpacklo_epi32(in[0 * instride], in[1 * instride]);
  u1 = _mm256_unpackhi_epi32(in[0 * instride], in[1 * instride]);

  u2 = _mm256_unpacklo_epi32(in[2 * instride], in[3 * instride]);
  u3 = _mm256_unpackhi_epi32(in[2 * instride], in[3 * instride]);

  u4 = _mm256_unpacklo_epi32(in[4 * instride], in[5 * instride]);
  u5 = _mm256_unpackhi_epi32(in[4 * instride], in[5 * instride]);

  u6 = _mm256_unpacklo_epi32(in[6 * instride], in[7 * instride]);
  u7 = _mm256_unpackhi_epi32(in[6 * instride], in[7 * instride]);

  x0 = _mm256_unpacklo_epi64(u0, u2);
  x1 = _mm256_unpacklo_epi64(u4, u6);
  out[0 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x20);
  out[4 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x31);

  x0 = _mm256_unpackhi_epi64(u0, u2);
  x1 = _mm256_unpackhi_epi64(u4, u6);
  out[1 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x20);
  out[5 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x31);

  x0 = _mm256_unpacklo_epi64(u1, u3);
  x1 = _mm256_unpacklo_epi64(u5, u7);
  out[2 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x20);
  out[6 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x31);

  x0 = _mm256_unpackhi_epi64(u1, u3);
  x1 = _mm256_unpackhi_epi64(u5, u7);
  out[3 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x20);
  out[7 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x31);
}